

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

int rnd_offensive_item(monst *mtmp)

{
  permonst *ptr;
  boolean bVar1;
  int iVar2;
  int iVar3;
  obj *poVar4;
  obj *helmet;
  int difficulty;
  permonst *pm;
  monst *mtmp_local;
  
  ptr = mtmp->data;
  iVar2 = monsndx(ptr);
  iVar2 = monstr[iVar2];
  if (((((ptr->mflags1 & 0x40000) == 0) && (bVar1 = attacktype(ptr,0xd), bVar1 == '\0')) &&
      ((mtmp->data->mflags1 & 0x10000) == 0)) && ((ptr->mlet != '6' && (ptr->mlet != '%')))) {
    if ((iVar2 < 8) || (iVar3 = rn2(0x23), iVar3 != 0)) {
      iVar2 = rn2(((uint)(6 < iVar2) * 4 - (uint)(iVar2 < 4)) + 9);
      switch(iVar2) {
      case 0:
        poVar4 = which_armor(mtmp,4);
        if (((((poVar4 != (obj *)0x0) &&
              (10 < (*(ushort *)&objects[poVar4->otyp].field_0x11 >> 4 & 0x1f))) &&
             ((*(ushort *)&objects[poVar4->otyp].field_0x11 >> 4 & 0x1f) < 0x12)) ||
            (((ptr->mflags1 & 4) != 0 || ((ptr->mflags1 & 8) != 0)))) ||
           ((ptr->mlet == '6' || ((ptr->mflags1 & 0x100000) != 0)))) {
          return 0x163;
        }
      case 1:
        mtmp_local._4_4_ = 0x1c4;
        break;
      case 2:
        mtmp_local._4_4_ = 0x141;
        break;
      case 3:
        mtmp_local._4_4_ = 0x12d;
        break;
      case 4:
        mtmp_local._4_4_ = 0x133;
        break;
      case 5:
        mtmp_local._4_4_ = 0x13d;
        break;
      case 6:
        mtmp_local._4_4_ = 0x12e;
        break;
      case 7:
      case 8:
        mtmp_local._4_4_ = 0x1d0;
        break;
      case 9:
        mtmp_local._4_4_ = 0x1d3;
        break;
      case 10:
        mtmp_local._4_4_ = 0x1d1;
        break;
      case 0xb:
        mtmp_local._4_4_ = 0x1d2;
        break;
      case 0xc:
        mtmp_local._4_4_ = 0x1d5;
        break;
      default:
        mtmp_local._4_4_ = 0;
      }
    }
    else {
      mtmp_local._4_4_ = 0x1d4;
    }
  }
  else {
    mtmp_local._4_4_ = 0;
  }
  return mtmp_local._4_4_;
}

Assistant:

int rnd_offensive_item(struct monst *mtmp)
{
	const struct permonst *pm = mtmp->data;
	int difficulty = monstr[monsndx(pm)];

	if (is_animal(pm) || attacktype(pm, AT_EXPL) || mindless(mtmp->data)
			|| pm->mlet == S_GHOST || pm->mlet == S_KOP)
	    return 0;
	if (difficulty > 7 && !rn2(35)) return WAN_DEATH;
	switch (rn2(9 - (difficulty < 4) + 4 * (difficulty > 6))) {
		case 0: {
		    struct obj *helmet = which_armor(mtmp, W_ARMH);

		    if ((helmet && is_metallic(helmet)) || amorphous(pm) || passes_walls(pm) || noncorporeal(pm) || unsolid(pm))
			return SCR_EARTH;
		} /* fall through */
		case 1: return WAN_STRIKING;
		case 2: return POT_ACID;
		case 3: return POT_CONFUSION;
		case 4: return POT_BLINDNESS;
		case 5: return POT_SLEEPING;
		case 6: return POT_PARALYSIS;
		case 7: case 8:
			return WAN_MAGIC_MISSILE;
		case 9: return WAN_SLEEP;
		case 10: return WAN_FIRE;
		case 11: return WAN_COLD;
		case 12: return WAN_LIGHTNING;
	}
	/*NOTREACHED*/
	return 0;
}